

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uo_tcp_conn.c
# Opt level: O2

uo_tcp_conn * uo_tcp_conn_create_for_server(int sockfd,uo_tcp_server *tcp_server)

{
  uo_tcp_conn *hashtbl;
  uo_buf puVar1;
  
  hashtbl = (uo_tcp_conn *)calloc(1,0x68);
  (hashtbl->field_1).tcp_server = tcp_server;
  hashtbl->evt_handlers = &tcp_server->evt_handlers;
  puVar1 = uo_buf_alloc(0x200);
  hashtbl->rbuf = puVar1;
  puVar1 = uo_buf_alloc(0x200);
  hashtbl->wbuf = puVar1;
  hashtbl->sockfd = sockfd;
  uo_strhashtbl_create_at((uo_strhashtbl *)hashtbl,0);
  hashtbl->state = '\0';
  return hashtbl;
}

Assistant:

uo_tcp_conn *uo_tcp_conn_create_for_server(
    int sockfd,
    uo_tcp_server *tcp_server)
{
    uo_tcp_conn *tcp_conn = calloc(1, sizeof *tcp_conn);
    tcp_conn->tcp_server = tcp_server;
    tcp_conn->evt_handlers = &tcp_server->evt_handlers;
    tcp_conn->rbuf = uo_buf_alloc(UO_TCP_BUF_SIZE);
    tcp_conn->wbuf = uo_buf_alloc(UO_TCP_BUF_SIZE);
    tcp_conn->sockfd = sockfd;

    uo_strhashtbl_create_at(&tcp_conn->user_data, 0);

    atomic_init(&tcp_conn->state, '\0');

    return tcp_conn;
}